

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O1

string * __thiscall
OperatorChar::toString_abi_cxx11_(string *__return_storage_ptr__,OperatorChar *this)

{
  char cVar1;
  char cVar2;
  
  cVar1 = this->mOp1;
  if (this->mIsTwoChars == true) {
    cVar2 = this->mOp2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(ushort *)&__return_storage_ptr__->field_2 = CONCAT11(cVar2,cVar1);
    __return_storage_ptr__->_M_string_length = 2;
    (__return_storage_ptr__->field_2)._M_local_buf[2] = '\0';
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = cVar1;
  __return_storage_ptr__->_M_string_length = 1;
  (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string OperatorChar::toString() const {
	if (mIsTwoChars) {
		return std::string({ mOp1, mOp2 });
	} else {
		return std::string({ mOp1 });
	}
}